

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_ext_instance_resolve_argument(ly_ctx *ctx,lysp_ext_instance *ext_p)

{
  int iVar1;
  LY_ERR LVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  char *pcVar5;
  bool bVar6;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar7;
  size_t sStack_78;
  LY_ERR ret__;
  size_t prefix_ext_len;
  size_t prefix_arg_len;
  size_t name_ext_len;
  size_t name_arg_len;
  char *prefix_ext;
  char *prefix_arg;
  char *name_ext;
  char *name_arg;
  char *ext;
  char *arg;
  lysp_stmt *stmt;
  lysp_ext_instance *ext_p_local;
  ly_ctx *ctx_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  stmt = (lysp_stmt *)ext_p;
  ext_p_local = (lysp_ext_instance *)ctx;
  if (ext_p->def == (lysp_ext *)0x0) {
    __assert_fail("ext_p->def",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                  ,0x848,
                  "LY_ERR lysp_ext_instance_resolve_argument(struct ly_ctx *, struct lysp_ext_instance *)"
                 );
  }
  if ((ext_p->def->argname == (char *)0x0) || (ext_p->argument != (char *)0x0)) {
    return LY_SUCCESS;
  }
  if (ext_p->format == LY_VALUE_XML) {
    if ((ext_p->def->flags & 0x80) == 0) {
      arg = (char *)ext_p->child;
      while( true ) {
        bVar6 = false;
        if (arg != (char *)0x0) {
          bVar6 = (*(ushort *)(arg + 0x30) & 0x400) != 0;
        }
        if ((!bVar6) || (iVar1 = strcmp(*(char **)arg,stmt->next->arg), iVar1 == 0)) break;
        arg = *(char **)(arg + 0x20);
      }
    }
    else {
      arg = (char *)ext_p->child;
      while( true ) {
        bVar6 = false;
        if (arg != (char *)0x0) {
          bVar6 = (*(ushort *)(arg + 0x30) & 0x400) != 0;
        }
        if (!bVar6) break;
        arg = *(char **)(arg + 0x20);
      }
      if (arg != (char *)0x0) {
        arg = (char *)ext_p->child;
        ext = ((lysp_stmt *)arg)->stmt;
        ly_parse_nodeid(&ext,&prefix_ext,&prefix_ext_len,&name_ext,&name_ext_len);
        iVar1 = ly_strncmp(stmt->next->arg,name_ext,name_ext_len);
        if (iVar1 != 0) {
          ly_vlog((ly_ctx *)ext_p_local,(char *)0x0,LYVE_SEMANTICS,
                  "Extension instance \"%s\" expects argument element \"%s\" as its first XML child, but \"%.*s\" element found."
                  ,stmt->stmt,stmt->next->arg,CONCAT44(uVar7,(int)name_ext_len),name_ext);
          return LY_EVALID;
        }
        name_arg = stmt->stmt;
        ly_parse_nodeid(&name_arg,(char **)&name_arg_len,&stack0xffffffffffffff88,&prefix_arg,
                        &prefix_arg_len);
        plVar3 = ly_resolve_prefix((ly_ctx *)ext_p_local,(void *)name_arg_len,sStack_78,stmt->format
                                   ,stmt->prefix_data);
        plVar4 = ly_resolve_prefix((ly_ctx *)ext_p_local,prefix_ext,prefix_ext_len,
                                   *(LY_VALUE_FORMAT *)(arg + 0x10),*(void **)(arg + 0x18));
        if (plVar3 != plVar4) {
          ly_vlog((ly_ctx *)ext_p_local,(char *)0x0,LYVE_SEMANTICS,
                  "Extension instance \"%s\" element and its argument element \"%s\" are expected in the same namespace, but they differ."
                  ,stmt->stmt,stmt->next->arg);
          return LY_EVALID;
        }
      }
    }
    if (arg != (char *)0x0) {
      LVar2 = lydict_insert((ly_ctx *)ext_p_local,*(char **)(arg + 8),0,&stmt->arg);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      *(ushort *)(arg + 0x30) = *(ushort *)(arg + 0x30) | 0x800;
    }
  }
  if (stmt->arg == (char *)0x0) {
    pcVar5 = "";
    if (((ulong)stmt->next->child & 0x80) != 0) {
      pcVar5 = "element ";
    }
    ly_vlog((ly_ctx *)ext_p_local,(char *)0x0,LYVE_SEMANTICS,
            "Extension instance \"%s\" missing argument %s\"%s\".",stmt->stmt,pcVar5,stmt->next->arg
           );
    ctx_local._4_4_ = LY_EVALID;
  }
  else {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
lysp_ext_instance_resolve_argument(struct ly_ctx *ctx, struct lysp_ext_instance *ext_p)
{
    assert(ext_p->def);

    if (!ext_p->def->argname || ext_p->argument) {
        /* nothing to do */
        return LY_SUCCESS;
    }

    if (ext_p->format == LY_VALUE_XML) {
        /* schema was parsed from YIN and an argument is expected, ... */
        struct lysp_stmt *stmt = NULL;

        if (ext_p->def->flags & LYS_YINELEM_TRUE) {
            /* ... argument was the first XML child element */
            for (stmt = ext_p->child; stmt && (stmt->flags & LYS_YIN_ATTR); stmt = stmt->next) {}
            if (stmt) {
                const char *arg, *ext, *name_arg, *name_ext, *prefix_arg, *prefix_ext;
                size_t name_arg_len, name_ext_len, prefix_arg_len, prefix_ext_len;

                stmt = ext_p->child;

                arg = stmt->stmt;
                ly_parse_nodeid(&arg, &prefix_arg, &prefix_arg_len, &name_arg, &name_arg_len);
                if (ly_strncmp(ext_p->def->argname, name_arg, name_arg_len)) {
                    LOGVAL(ctx, LYVE_SEMANTICS, "Extension instance \"%s\" expects argument element \"%s\" as its first XML child, "
                            "but \"%.*s\" element found.", ext_p->name, ext_p->def->argname, (int)name_arg_len, name_arg);
                    return LY_EVALID;
                }

                /* check namespace - all the extension instances must be qualified and argument element is expected in the same
                 * namespace. Do not check just prefixes, there can be different prefixes pointing to the same namespace */
                ext = ext_p->name; /* include prefix */
                ly_parse_nodeid(&ext, &prefix_ext, &prefix_ext_len, &name_ext, &name_ext_len);

                if (ly_resolve_prefix(ctx, prefix_ext, prefix_ext_len, ext_p->format, ext_p->prefix_data) !=
                        ly_resolve_prefix(ctx, prefix_arg, prefix_arg_len, stmt->format, stmt->prefix_data)) {
                    LOGVAL(ctx, LYVE_SEMANTICS, "Extension instance \"%s\" element and its argument element \"%s\" are "
                            "expected in the same namespace, but they differ.", ext_p->name, ext_p->def->argname);
                    return LY_EVALID;
                }
            }
        } else {
            /* ... argument was one of the XML attributes which are represented as child stmt with LYS_YIN_ATTR flag */
            for (stmt = ext_p->child; stmt && (stmt->flags & LYS_YIN_ATTR); stmt = stmt->next) {
                if (!strcmp(stmt->stmt, ext_p->def->argname)) {
                    /* this is the extension's argument */
                    break;
                }
            }
        }

        if (stmt) {
            LY_CHECK_RET(lydict_insert(ctx, stmt->arg, 0, &ext_p->argument));
            stmt->flags |= LYS_YIN_ARGUMENT;
        }
    }

    if (!ext_p->argument) {
        /* missing extension's argument */
        LOGVAL(ctx, LYVE_SEMANTICS, "Extension instance \"%s\" missing argument %s\"%s\".",
                ext_p->name, (ext_p->def->flags & LYS_YINELEM_TRUE) ? "element " : "", ext_p->def->argname);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}